

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O1

int duckdb::Comparators::TemplatedCompareVal<duckdb::interval_t>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  uVar1 = *(ulong *)*left_ptr;
  uVar2 = *(ulong *)((long)*left_ptr + 8);
  uVar3 = *(ulong *)*right_ptr;
  uVar4 = *(ulong *)((long)*right_ptr + 8);
  iVar7 = (int)uVar1;
  iVar10 = (int)uVar3;
  if ((iVar7 != iVar10) || (uVar2 != uVar4 || (uVar3 ^ uVar1) >> 0x20 != 0)) {
    lVar5 = (long)uVar2 / 86400000000 + ((long)uVar1 >> 0x20);
    lVar6 = (long)uVar4 / 86400000000 + ((long)uVar3 >> 0x20);
    if (((long)iVar7 + lVar5 / 0x1e != (long)iVar10 + lVar6 / 0x1e) ||
       ((lVar5 % 0x1e != lVar6 % 0x1e || ((long)uVar2 % 86400000000 != (long)uVar4 % 86400000000))))
    {
      lVar5 = (long)uVar4 / 86400000000 + ((long)uVar3 >> 0x20);
      lVar8 = lVar5 % 0x1e;
      lVar9 = (long)iVar10 + lVar5 / 0x1e;
      lVar6 = (long)uVar2 / 86400000000 + ((long)uVar1 >> 0x20);
      lVar5 = lVar6 % 0x1e;
      lVar6 = (long)iVar7 + lVar6 / 0x1e;
      if (lVar6 < lVar9) {
        return -1;
      }
      if (lVar9 < lVar6) {
        return 1;
      }
      if (lVar5 < lVar8) {
        return -1;
      }
      return -(uint)((long)uVar2 % 86400000000 < (long)uVar4 % 86400000000 && lVar5 <= lVar8) | 1;
    }
  }
  return 0;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}